

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::PrintStats(LinearScan *this)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  BranchInstr *this_00;
  LabelInstr *pLVar7;
  Opnd *pOVar8;
  SymOpnd *pSVar9;
  StackSym *pSVar10;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *instr;
  Instr *instrStop;
  Instr *__nextInstrCheck;
  uint local_28;
  uint uStack_24;
  bool isInHelper;
  uint instrCount;
  uint wLoadCount;
  uint wStoreCount;
  uint loadCount;
  uint storeCount;
  uint loopNest;
  LinearScan *this_local;
  
  loadCount = 0;
  wStoreCount = 0;
  wLoadCount = 0;
  instrCount = 0;
  uStack_24 = 0;
  local_28 = 0;
  bVar4 = false;
  instrStop = (Instr *)0x0;
  dst = (Opnd *)this->func->m_tailInstr;
  do {
    if (dst == (Opnd *)0x0) {
      if (loadCount != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x12b2,"(loopNest == 0)","loopNest == 0");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      Func::DumpFullFunctionName(this->func);
      Output::SkipToColumn(0x2d);
      Output::Print(L"Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n",
                    (ulong)local_28,(ulong)wLoadCount,(ulong)wStoreCount,(ulong)uStack_24,
                    (ulong)instrCount,uStack_24 + instrCount);
      return;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_prev != (Instr *)dst)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1274,
                         "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    instrStop = (Instr *)dst;
    IVar3 = IR::Instr::GetKind((Instr *)dst);
    switch(IVar3) {
    case InstrKindBranch:
      this_00 = IR::Instr::AsBranchInstr((Instr *)dst);
      bVar2 = IR::BranchInstr::IsLoopTail(this_00,this->func);
      if (bVar2) {
        loadCount = loadCount + 1;
      }
      local_28 = local_28 + 1;
      break;
    case InstrKindLabel:
    case InstrKindProfiledLabel:
      pLVar7 = IR::Instr::AsLabelInstr((Instr *)dst);
      if ((pLVar7->field_0x78 & 1) != 0) {
        if (loadCount == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1288,"(loopNest)","loopNest");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        loadCount = loadCount - 1;
      }
      pLVar7 = IR::Instr::AsLabelInstr((Instr *)dst);
      bVar4 = ((byte)pLVar7->field_0x78 >> 1 & 1) != 0;
      break;
    default:
      bVar2 = IR::Instr::IsRealInstr((Instr *)dst);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1291,"(instr->IsRealInstr())","instr->IsRealInstr()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (!bVar4) {
        pOVar8 = IR::Instr::GetDst((Instr *)dst);
        if ((pOVar8 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(pOVar8), bVar2)) {
          pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
          bVar2 = Sym::IsStackSym(pSVar9->m_sym);
          if (bVar2) {
            pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
            pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
            bVar2 = StackSym::IsAllocated(pSVar10);
            if (bVar2) {
              wStoreCount = wStoreCount + 1;
              uVar5 = GetUseSpillCost(loadCount,0);
              instrCount = uVar5 + instrCount;
            }
          }
        }
        pOVar8 = IR::Instr::GetSrc1((Instr *)dst);
        if (pOVar8 != (Opnd *)0x0) {
          bVar2 = IR::Opnd::IsSymOpnd(pOVar8);
          if (bVar2) {
            pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
            bVar2 = Sym::IsStackSym(pSVar9->m_sym);
            if (bVar2) {
              pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
              pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
              bVar2 = StackSym::IsAllocated(pSVar10);
              if (bVar2) {
                wLoadCount = wLoadCount + 1;
                uVar5 = GetUseSpillCost(loadCount,0);
                uStack_24 = uVar5 + uStack_24;
              }
            }
          }
          pOVar8 = IR::Instr::GetSrc2((Instr *)dst);
          if ((pOVar8 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(pOVar8), bVar2)) {
            pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
            bVar2 = Sym::IsStackSym(pSVar9->m_sym);
            if (bVar2) {
              pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
              pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
              bVar2 = StackSym::IsAllocated(pSVar10);
              if (bVar2) {
                wLoadCount = wLoadCount + 1;
                uVar5 = GetUseSpillCost(loadCount,0);
                uStack_24 = uVar5 + uStack_24;
              }
            }
          }
        }
      }
      break;
    case InstrKindPragma:
    }
    dst = *(Opnd **)&dst[1].m_valueType;
  } while( true );
}

Assistant:

void LinearScan::PrintStats() const
{
    uint loopNest = 0;
    uint storeCount = 0;
    uint loadCount = 0;
    uint wStoreCount = 0;
    uint wLoadCount = 0;
    uint instrCount = 0;
    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_BACKWARD(instr, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindPragma:
            continue;

        case IR::InstrKindBranch:
            if (instr->AsBranchInstr()->IsLoopTail(this->func))
            {
                loopNest++;
            }

            instrCount++;
            break;

        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                Assert(loopNest);
                loopNest--;
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;
            break;

        default:
            {
                Assert(instr->IsRealInstr());

                if (isInHelper)
                {
                    continue;
                }

                IR::Opnd *dst = instr->GetDst();
                if (dst && dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsStackSym() && dst->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                {
                    storeCount++;
                    wStoreCount += LinearScan::GetUseSpillCost(loopNest, false);
                }
                IR::Opnd *src1 = instr->GetSrc1();
                if (src1)
                {
                    if (src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsStackSym() && src1->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                    IR::Opnd *src2 = instr->GetSrc2();
                    if (src2 && src2->IsSymOpnd() && src2->AsSymOpnd()->m_sym->IsStackSym() && src2->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                }
            }
            break;
        }
    } NEXT_INSTR_IN_FUNC_BACKWARD;

    Assert(loopNest == 0);

    this->func->DumpFullFunctionName();
    Output::SkipToColumn(45);

    Output::Print(_u("Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n"),
        instrCount, loadCount, storeCount, wLoadCount, wStoreCount, wLoadCount+wStoreCount);
}